

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-proxy.c
# Opt level: O2

int main(int argc,char **argv)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ssize_t sVar5;
  int *piVar6;
  conn_t *pcVar7;
  char *pcVar8;
  FILE *pFVar9;
  char *pcVar10;
  int rs;
  ushort local_2ea;
  sockaddr local_2e8;
  pollfd pfd [2];
  socklen_t addrlen;
  conn_t server;
  addrinfo *ai;
  conn_t client;
  addrinfo local_268;
  char buffer [512];
  
  if (argc == 4) {
    lVar4 = strtol(argv[3],(char **)0x0,10);
    uVar1 = (ushort)lVar4;
    local_2ea = uVar1 << 8 | uVar1 >> 8;
    while (iVar2 = socket(2,1,0), pFVar9 = _stderr, iVar2 != -1) {
      rs = 1;
      setsockopt(iVar2,1,2,&rs,4);
      local_2e8.sa_data[6] = '\0';
      local_2e8.sa_data[7] = '\0';
      local_2e8.sa_data[8] = '\0';
      local_2e8.sa_data[9] = '\0';
      local_2e8.sa_data[10] = '\0';
      local_2e8.sa_data[0xb] = '\0';
      local_2e8.sa_data[0xc] = '\0';
      local_2e8.sa_data[0xd] = '\0';
      local_2e8.sa_data._0_2_ = local_2ea;
      local_2e8.sa_family = 2;
      local_2e8.sa_data._2_4_ = 0;
      iVar3 = bind(iVar2,&local_2e8,0x10);
      pFVar9 = _stderr;
      if (iVar3 == -1) {
        piVar6 = __errno_location();
        pcVar8 = strerror(*piVar6);
        pcVar10 = "bind() failed: %s\n";
LAB_0010174a:
        fprintf(pFVar9,pcVar10,pcVar8);
LAB_001017ff:
        close(iVar2);
        return 1;
      }
      printf("LISTENING ON PORT %d\n",(ulong)(uint)(int)(short)uVar1);
      iVar3 = listen(iVar2,1);
      pFVar9 = _stderr;
      if (iVar3 == -1) {
        piVar6 = __errno_location();
        pcVar8 = strerror(*piVar6);
        pcVar10 = "listen() failed: %s\n";
        goto LAB_0010174a;
      }
      addrlen = 0x10;
      client.sock = accept(iVar2,&local_2e8,&addrlen);
      pFVar9 = _stderr;
      if (client.sock == -1) {
        piVar6 = __errno_location();
        pcVar8 = strerror(*piVar6);
        pcVar10 = "accept() failed: %s\n";
        goto LAB_0010174a;
      }
      puts("CLIENT CONNECTION RECEIVED");
      close(iVar2);
      local_268.ai_flags = 0;
      local_268.ai_family = 0;
      local_268.ai_addrlen = 0;
      local_268._20_4_ = 0;
      local_268.ai_addr = (sockaddr *)0x0;
      local_268.ai_canonname = (char *)0x0;
      local_268.ai_next = (addrinfo *)0x0;
      local_268.ai_socktype = 1;
      local_268.ai_protocol = 0;
      rs = getaddrinfo(argv[1],argv[2],&local_268,(addrinfo **)&ai);
      pFVar9 = _stderr;
      if (rs != 0) {
        pcVar8 = argv[1];
        pcVar10 = gai_strerror(rs);
        fprintf(pFVar9,"getaddrinfo() failed for %s: %s\n",pcVar8,pcVar10);
        iVar2 = client.sock;
        goto LAB_001017ff;
      }
      server.sock = socket(2,1,0);
      pFVar9 = _stderr;
      if (server.sock == -1) {
        piVar6 = __errno_location();
        pcVar8 = strerror(*piVar6);
        pcVar10 = "socket() failed: %s\n";
LAB_001017ee:
        fprintf(pFVar9,pcVar10,pcVar8);
        iVar2 = server.sock;
        goto LAB_001017ff;
      }
      local_2e8.sa_data[6] = '\0';
      local_2e8.sa_data[7] = '\0';
      local_2e8.sa_data[8] = '\0';
      local_2e8.sa_data[9] = '\0';
      local_2e8.sa_data[10] = '\0';
      local_2e8.sa_data[0xb] = '\0';
      local_2e8.sa_data[0xc] = '\0';
      local_2e8.sa_data[0xd] = '\0';
      local_2e8.sa_family = 2;
      local_2e8.sa_data[0] = '\0';
      local_2e8.sa_data[1] = '\0';
      local_2e8.sa_data[2] = '\0';
      local_2e8.sa_data[3] = '\0';
      local_2e8.sa_data[4] = '\0';
      local_2e8.sa_data[5] = '\0';
      iVar2 = bind(server.sock,&local_2e8,0x10);
      pFVar9 = _stderr;
      if (iVar2 == -1) {
        piVar6 = __errno_location();
        pcVar8 = strerror(*piVar6);
        pcVar10 = "bind() failed: %s\n";
        goto LAB_001017ee;
      }
      iVar2 = connect(server.sock,(sockaddr *)ai->ai_addr,ai->ai_addrlen);
      pFVar9 = _stderr;
      if (iVar2 == -1) {
        piVar6 = __errno_location();
        pcVar8 = strerror(*piVar6);
        pcVar10 = "server() failed: %s\n";
        goto LAB_001017ee;
      }
      freeaddrinfo((addrinfo *)ai);
      puts("SERVER CONNECTION ESTABLISHED");
      server.name = "SERVER";
      client.name = "CLIENT";
      client.remote = &server;
      server.remote = &client;
      server.telnet = telnet_init((telnet_telopt_t *)0x0,_event_handler,'\x01',client.remote);
      client.telnet = telnet_init((telnet_telopt_t *)0x0,_event_handler,'\x01',&client);
      pfd[0].events = 1;
      pfd[0].fd = server.sock;
      pfd[0].revents = 0;
      pfd[1].events = 1;
      pfd[1].fd = client.sock;
      pfd[1].revents = 0;
LAB_00101588:
      iVar2 = poll((pollfd *)pfd,2,-1);
      if (iVar2 != -1) {
        if (((ulong)pfd[0] & 0x19000000000000) == 0) goto LAB_001015ef;
        sVar5 = recv(server.sock,buffer,0x200,0);
        rs = (int)sVar5;
        if (0 < rs) {
          telnet_recv(server.telnet,buffer,(ulong)(rs & 0x7fffffff));
          goto LAB_001015ef;
        }
        if (rs != 0) {
          piVar6 = __errno_location();
          iVar2 = *piVar6;
          if ((iVar2 != 4) && (iVar2 != 0x68)) goto LAB_00101819;
          goto LAB_001015ef;
        }
        pcVar7 = &server;
        goto LAB_00101657;
      }
LAB_00101668:
      telnet_free(server.telnet);
      telnet_free(client.telnet);
      close(server.sock);
      close(client.sock);
      puts("BOTH CONNECTIONS CLOSED");
    }
    piVar6 = __errno_location();
    pcVar8 = strerror(*piVar6);
    fprintf(pFVar9,"socket() failed: %s\n",pcVar8);
  }
  else {
    fwrite("Usage:\n ./telnet-proxy <remote ip> <remote port> <local port>\n",0x3e,1,_stderr);
  }
  return 1;
LAB_001015ef:
  if (((ulong)pfd[1] & 0x19000000000000) != 0) {
    sVar5 = recv(client.sock,buffer,0x200,0);
    rs = (int)sVar5;
    if (rs < 1) {
      if (rs == 0) {
        pcVar7 = &client;
LAB_00101657:
        printf("%s DISCONNECTED\n",pcVar7->name);
        goto LAB_00101668;
      }
      piVar6 = __errno_location();
      iVar2 = *piVar6;
      if ((iVar2 != 4) && (iVar2 != 0x68)) {
LAB_00101819:
        pFVar9 = _stderr;
        pcVar8 = strerror(iVar2);
        fprintf(pFVar9,"recv(server) failed: %s\n",pcVar8);
        exit(1);
      }
    }
    else {
      telnet_recv(client.telnet,buffer,(ulong)(rs & 0x7fffffff));
    }
  }
  goto LAB_00101588;
}

Assistant:

int main(int argc, char **argv) {
	char buffer[512];
	short listen_port;
	SOCKET listen_sock;
	int rs;
	struct sockaddr_in addr;
	socklen_t addrlen;
	struct pollfd pfd[2];
	struct conn_t server;
	struct conn_t client;
	struct addrinfo *ai;
	struct addrinfo hints;

	/* initialize Winsock */
#if defined(_WIN32)
	WSADATA wsd;
	WSAStartup(MAKEWORD(2, 2), &wsd);
#endif

	/* check usage */
	if (argc != 4) {
		fprintf(stderr, "Usage:\n ./telnet-proxy <remote ip> <remote port> "
				"<local port>\n");
		return 1;
	}

	/* parse listening port */
	listen_port = (short)strtol(argv[3], 0, 10);

	/* loop forever, until user kills process */
	for (;;) {
		/* create listening socket */
		if ((listen_sock = socket(AF_INET, SOCK_STREAM, 0)) == -1) {
			fprintf(stderr, "socket() failed: %s\n", strerror(errno));
			return 1;
		}

		/* reuse address option */
		rs = 1;
		setsockopt(listen_sock, SOL_SOCKET, SO_REUSEADDR, (char*)&rs, sizeof(rs));

		/* bind to listening addr/port */
		memset(&addr, 0, sizeof(addr));
		addr.sin_family = AF_INET;
		addr.sin_addr.s_addr = INADDR_ANY;
		addr.sin_port = htons(listen_port);
		if (bind(listen_sock, (struct sockaddr *)&addr, sizeof(addr)) == -1) {
			fprintf(stderr, "bind() failed: %s\n", strerror(errno));
			close(listen_sock);
			return 1;
		}

		printf("LISTENING ON PORT %d\n", listen_port);

		/* wait for client */
		if (listen(listen_sock, 1) == -1) {
			fprintf(stderr, "listen() failed: %s\n", strerror(errno));
			close(listen_sock);
			return 1;
		}
		addrlen = sizeof(addr);
		if ((client.sock = accept(listen_sock, (struct sockaddr *)&addr,
				&addrlen)) == -1) {
			fprintf(stderr, "accept() failed: %s\n", strerror(errno));
			close(listen_sock);
			return 1;
		}

		printf("CLIENT CONNECTION RECEIVED\n");
		
		/* stop listening now that we have a client */
		close(listen_sock);

		/* look up server host */
		memset(&hints, 0, sizeof(hints));
		hints.ai_family = AF_UNSPEC;
		hints.ai_socktype = SOCK_STREAM;
		if ((rs = getaddrinfo(argv[1], argv[2], &hints, &ai)) != 0) {
			fprintf(stderr, "getaddrinfo() failed for %s: %s\n", argv[1],
					gai_strerror(rs));
			close(client.sock);
			return 1;
		}
		
		/* create server socket */
		if ((server.sock = socket(AF_INET, SOCK_STREAM, 0)) == -1) {
			fprintf(stderr, "socket() failed: %s\n", strerror(errno));
			close(server.sock);
			return 1;
		}

		/* bind server socket */
		memset(&addr, 0, sizeof(addr));
		addr.sin_family = AF_INET;
		if (bind(server.sock, (struct sockaddr *)&addr, sizeof(addr)) == -1) {
			fprintf(stderr, "bind() failed: %s\n", strerror(errno));
			close(server.sock);
			return 1;
		}

		/* connect */
		if (connect(server.sock, ai->ai_addr, (int)ai->ai_addrlen) == -1) {
			fprintf(stderr, "server() failed: %s\n", strerror(errno));
			close(server.sock);
			return 1;
		}

		/* free address lookup info */
		freeaddrinfo(ai);

		printf("SERVER CONNECTION ESTABLISHED\n");

		/* initialize connection structs */
		server.name = COLOR_SERVER "SERVER";
		server.remote = &client;
		client.name = COLOR_CLIENT "CLIENT";
		client.remote = &server;

		/* initialize telnet boxes */
		server.telnet = telnet_init(0, _event_handler, TELNET_FLAG_PROXY,
				&server);
		client.telnet = telnet_init(0, _event_handler, TELNET_FLAG_PROXY,
				&client);

		/* initialize poll descriptors */
		memset(pfd, 0, sizeof(pfd));
		pfd[0].fd = server.sock;
		pfd[0].events = POLLIN;
		pfd[1].fd = client.sock;
		pfd[1].events = POLLIN;

		/* loop while both connections are open */
		while (poll(pfd, 2, -1) != -1) {
			/* read from server */
			if (pfd[0].revents & (POLLIN | POLLERR | POLLHUP)) {
				if ((rs = recv(server.sock, buffer, sizeof(buffer), 0)) > 0) {
					telnet_recv(server.telnet, buffer, rs);
				} else if (rs == 0) {
					printf("%s DISCONNECTED" COLOR_NORMAL "\n", server.name);
					break;
				} else {
					if (errno != EINTR && errno != ECONNRESET) {
						fprintf(stderr, "recv(server) failed: %s\n",
								strerror(errno));
						exit(1);
					}
				}
			}

			/* read from client */
			if (pfd[1].revents & (POLLIN | POLLERR | POLLHUP)) {
				if ((rs = recv(client.sock, buffer, sizeof(buffer), 0)) > 0) {
					telnet_recv(client.telnet, buffer, rs);
				} else if (rs == 0) {
					printf("%s DISCONNECTED" COLOR_NORMAL "\n", client.name);
					break;
				} else {
					if (errno != EINTR && errno != ECONNRESET) {
						fprintf(stderr, "recv(server) failed: %s\n",
								strerror(errno));
						exit(1);
					}
				}
			}
		}

		/* clean up */
		telnet_free(server.telnet);
		telnet_free(client.telnet);
		close(server.sock);
		close(client.sock);

		/* all done */
		printf("BOTH CONNECTIONS CLOSED\n");
	}

	/* not that we can reach this, but GCC will cry if it's not here */
	return 0;
}